

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HMAC.c
# Opt level: O1

void EverCrypt_HMAC_compute
               (Spec_Hash_Definitions_hash_alg a,uint8_t *mac,uint8_t *key,uint32_t keylen,
               uint8_t *data,uint32_t datalen)

{
  _Bool _Var1;
  _Bool _Var2;
  int extraout_EDX;
  uint uVar3;
  undefined7 in_register_00000039;
  uint32_t *st;
  uint32_t *puVar4;
  
  uVar3 = (int)CONCAT71(in_register_00000039,a) - 1;
  puVar4 = (uint32_t *)(ulong)uVar3;
  st = puVar4;
  if (uVar3 < 7) {
    st = (uint32_t *)
         ((long)&switchD_00179e5a::switchdataD_001e51e0 +
         (long)(int)(&switchD_00179e5a::switchdataD_001e51e0)[(long)puVar4]);
    switch(puVar4) {
    case (uint32_t *)0x0:
      EverCrypt_HMAC_compute_sha2_256(mac,key,keylen,data,datalen);
      return;
    case (uint32_t *)0x1:
      EverCrypt_HMAC_compute_sha2_384(mac,key,keylen,data,datalen);
      return;
    case (uint32_t *)0x2:
      EverCrypt_HMAC_compute_sha2_512(mac,key,keylen,data,datalen);
      return;
    case (uint32_t *)0x3:
      EverCrypt_HMAC_compute_sha1(mac,key,keylen,data,datalen);
      return;
    case (uint32_t *)0x5:
      EverCrypt_HMAC_compute_blake2s(mac,key,keylen,data,datalen);
      return;
    case (uint32_t *)0x6:
      EverCrypt_HMAC_compute_blake2b(mac,key,keylen,data,datalen);
      return;
    }
  }
  EverCrypt_HMAC_compute_cold_1();
  _Var1 = EverCrypt_AutoConfig2_has_shaext();
  _Var2 = EverCrypt_AutoConfig2_has_sse();
  if (_Var2 && _Var1) {
    sha256_update(st,mac,extraout_EDX,k224_256);
    return;
  }
  Hacl_Hash_SHA2_sha256_update_nblocks(extraout_EDX << 6,mac,st);
  return;
}

Assistant:

void
EverCrypt_HMAC_compute(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *mac,
  uint8_t *key,
  uint32_t keylen,
  uint8_t *data,
  uint32_t datalen
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        EverCrypt_HMAC_compute_sha1(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_HMAC_compute_sha2_256(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        EverCrypt_HMAC_compute_sha2_384(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        EverCrypt_HMAC_compute_sha2_512(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        EverCrypt_HMAC_compute_blake2s(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        EverCrypt_HMAC_compute_blake2b(mac, key, keylen, data, datalen);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}